

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::anon_unknown_1::CoordFragmentShader::shadeFragments
          (CoordFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  FragmentPacket *packet;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  if (0 < numPackets) {
    lVar7 = 0;
    do {
      rr::readVarying<float>((rr *)&local_40,packets,context,0,0);
      rr::readVarying<float>((rr *)&local_50,packets,context,0,1);
      rr::readVarying<float>((rr *)&local_60,packets,context,0,2);
      rr::readVarying<float>((rr *)&local_70,packets,context,0,3);
      pGVar1 = context->outputArray;
      iVar3 = context->numFragmentOutputs;
      iVar2 = (int)lVar7;
      iVar4 = (iVar2 + 1) * iVar3;
      iVar5 = (iVar2 + 2) * iVar3;
      iVar6 = (iVar2 + 3) * iVar3;
      iVar3 = iVar3 * iVar2;
      pGVar1[iVar3].v.fData[0] = local_40 * local_34;
      pGVar1[iVar3].v.fData[1] = local_3c * local_34;
      pGVar1[iVar3].v.fData[2] = local_34 * local_38;
      pGVar1[iVar3].v.uData[3] = 0x3f800000;
      pGVar1[iVar4].v.fData[0] = local_50 * local_44;
      pGVar1[iVar4].v.fData[1] = local_4c * local_44;
      pGVar1[iVar4].v.fData[2] = local_44 * local_48;
      pGVar1[iVar4].v.uData[3] = 0x3f800000;
      pGVar1[iVar5].v.fData[0] = local_60 * local_54;
      pGVar1[iVar5].v.fData[1] = local_5c * local_54;
      pGVar1[iVar5].v.fData[2] = local_54 * local_58;
      pGVar1[iVar5].v.uData[3] = 0x3f800000;
      pGVar1[iVar6].v.fData[0] = local_70 * local_64;
      pGVar1[iVar6].v.fData[1] = local_6c * local_64;
      pGVar1[iVar6].v.fData[2] = local_64 * local_68;
      pGVar1[iVar6].v.uData[3] = 0x3f800000;
      packets = packets + 1;
      lVar7 = lVar7 + 4;
    } while ((ulong)(uint)numPackets << 2 != lVar7);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= vtxColor0;
			const tcu::Vec4		color1		= vtxColor1;
			const tcu::Vec4		color2		= vtxColor2;
			const tcu::Vec4		color3		= vtxColor3;

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}